

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text-buffer.cc
# Opt level: O2

void __thiscall TextBuffer::consolidate_layers(TextBuffer *this)

{
  byte bVar1;
  TextBuffer *this_00;
  Layer *layer;
  vector<TextBuffer::Layer_*,_std::allocator<TextBuffer::Layer_*>_> mutable_layers;
  Layer *local_40;
  _Vector_base<TextBuffer::Layer_*,_std::allocator<TextBuffer::Layer_*>_> local_38;
  
  local_40 = this->top_layer;
  local_38._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_38._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar1 = 0;
  this_00 = this;
  for (; local_40 != (Layer *)0x0; local_40 = local_40->previous_layer) {
    if ((bVar1 == 0) && (local_40->snapshot_count == 0)) {
      if (local_40 == this->base_layer) {
        squash_layers(this_00,(vector<TextBuffer::Layer_*,_std::allocator<TextBuffer::Layer_*>_> *)
                              &local_38);
        if (local_38._M_impl.super__Vector_impl_data._M_finish !=
            local_38._M_impl.super__Vector_impl_data._M_start) {
          local_38._M_impl.super__Vector_impl_data._M_finish =
               local_38._M_impl.super__Vector_impl_data._M_start;
        }
      }
      if ((local_40->text).is_some == true) {
        local_40->uses_patch = false;
      }
      this_00 = (TextBuffer *)&local_38;
      std::vector<TextBuffer::Layer_*,_std::allocator<TextBuffer::Layer_*>_>::push_back
                ((vector<TextBuffer::Layer_*,_std::allocator<TextBuffer::Layer_*>_> *)&local_38,
                 &local_40);
      bVar1 = 0;
    }
    else {
      squash_layers(this_00,(vector<TextBuffer::Layer_*,_std::allocator<TextBuffer::Layer_*>_> *)
                            &local_38);
      bVar1 = 1;
      if (local_38._M_impl.super__Vector_impl_data._M_finish !=
          local_38._M_impl.super__Vector_impl_data._M_start) {
        local_38._M_impl.super__Vector_impl_data._M_finish =
             local_38._M_impl.super__Vector_impl_data._M_start;
      }
    }
    bVar1 = bVar1 & local_40->uses_patch;
  }
  squash_layers(this_00,(vector<TextBuffer::Layer_*,_std::allocator<TextBuffer::Layer_*>_> *)
                        &local_38);
  std::_Vector_base<TextBuffer::Layer_*,_std::allocator<TextBuffer::Layer_*>_>::~_Vector_base
            (&local_38);
  return;
}

Assistant:

void TextBuffer::consolidate_layers() {
  Layer *layer = top_layer;
  vector<Layer *> mutable_layers;
  bool needed_by_layer_above = false;

  while (layer) {
    if (needed_by_layer_above || layer->snapshot_count > 0) {
      squash_layers(mutable_layers);
      mutable_layers.clear();
      needed_by_layer_above = true;
    } else {
      if (layer == base_layer) {
        squash_layers(mutable_layers);
        mutable_layers.clear();
      }

      if (layer->text) layer->uses_patch = false;
      mutable_layers.push_back(layer);
    }

    if (!layer->uses_patch) needed_by_layer_above = false;
    layer = layer->previous_layer;
  }

  squash_layers(mutable_layers);
}